

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int getfield(lua_State *L,char *key,int d)

{
  int iVar1;
  lua_Integer lVar2;
  undefined4 local_20;
  int res;
  int d_local;
  char *key_local;
  lua_State *L_local;
  
  lua_getfield(L,-1,key);
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    local_20 = d;
    if (d < 0) {
      lj_err_callerv(L,LJ_ERR_OSDATEF,key);
    }
  }
  else {
    lVar2 = lua_tointeger(L,-1);
    local_20 = (int)lVar2;
  }
  lua_settop(L,-2);
  return local_20;
}

Assistant:

static int getfield(lua_State *L, const char *key, int d)
{
  int res;
  lua_getfield(L, -1, key);
  if (lua_isnumber(L, -1)) {
    res = (int)lua_tointeger(L, -1);
  } else {
    if (d < 0)
      lj_err_callerv(L, LJ_ERR_OSDATEF, key);
    res = d;
  }
  lua_pop(L, 1);
  return res;
}